

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.h
# Opt level: O1

string * __thiscall
Assimp::ColladaExporter::GetMeshId_abi_cxx11_
          (string *__return_storage_ptr__,ColladaExporter *this,size_t pIndex)

{
  size_type *psVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"meshId","");
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  uVar4 = 0xf;
  if (local_1b0 != local_1a0) {
    uVar4 = local_1a0[0];
  }
  if (uVar4 < (ulong)(local_1c8 + local_1a8)) {
    uVar4 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar4 = local_1c0[0];
    }
    if ((ulong)(local_1c8 + local_1a8) <= uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1b0);
      goto LAB_00325ab7;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1d0);
LAB_00325ab7:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar2 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetMeshId( size_t pIndex) const {
        return std::string( "meshId" ) + to_string(pIndex);
    }